

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O0

Am_Wrapper * __thiscall Key_Offset_Store_Data::Make_Unique(Key_Offset_Store_Data *this)

{
  bool bVar1;
  Key_Offset_Store_Data *this_local;
  
  bVar1 = Am_Wrapper::Is_Unique(&this->super_Am_Wrapper);
  this_local = this;
  if (!bVar1) {
    Am_Wrapper::Release(&this->super_Am_Wrapper);
    this_local = (Key_Offset_Store_Data *)operator_new(0x18);
    Key_Offset_Store_Data(this_local,this);
  }
  return &this_local->super_Am_Wrapper;
}

Assistant:

inline void
modify_value(Am_Value &value, int offset, float multiplier)
{
  switch (value.type) {
  case Am_INT:
  case Am_LONG:
    value.value.long_value =
        (long)(value.value.long_value * multiplier) + offset;
    break;
  case Am_FLOAT:
    value.value.float_value = (value.value.float_value * multiplier) + offset;
    break;
  case Am_DOUBLE: {
    double d_value = value;
    d_value = (d_value * multiplier) + offset;
    value = d_value;
    break;
  }
  default:
    break;
  }
}